

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

void jpeg_stdio_src(j_decompress_ptr cinfo,FILE *infile)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  long *in_RDI;
  my_src_ptr src;
  
  if (in_RDI[5] == 0) {
    lVar2 = (**(code **)in_RDI[1])(in_RDI,0,0x50);
    in_RDI[5] = lVar2;
    lVar2 = in_RDI[5];
    uVar3 = (**(code **)in_RDI[1])(in_RDI,0,0x1000);
    *(undefined8 *)(lVar2 + 0x40) = uVar3;
  }
  else if (*(code **)(in_RDI[5] + 0x10) != init_source) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  puVar1 = (undefined8 *)in_RDI[5];
  puVar1[2] = init_source;
  puVar1[3] = fill_input_buffer;
  puVar1[4] = skip_input_data;
  puVar1[5] = jpeg_resync_to_restart;
  puVar1[6] = term_source;
  puVar1[7] = in_RSI;
  puVar1[1] = 0;
  *puVar1 = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_src(j_decompress_ptr cinfo, FILE *infile)
{
  my_src_ptr src;

  /* The source object and input buffer are made permanent so that a series
   * of JPEG images can be read from the same file by calling jpeg_stdio_src
   * only before the first one.  (If we discarded the buffer at the end of
   * one image, we'd likely lose the start of the next one.)
   */
  if (cinfo->src == NULL) {     /* first time for this JPEG object? */
    cinfo->src = (struct jpeg_source_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_source_mgr));
    src = (my_src_ptr)cinfo->src;
    src->buffer = (JOCTET *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  INPUT_BUF_SIZE * sizeof(JOCTET));
  } else if (cinfo->src->init_source != init_source) {
    /* It is unsafe to reuse the existing source manager unless it was created
     * by this function.  Otherwise, there is no guarantee that the opaque
     * structure is the right size.  Note that we could just create a new
     * structure, but the old structure would not be freed until
     * jpeg_destroy_decompress() was called.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  src = (my_src_ptr)cinfo->src;
  src->pub.init_source = init_source;
  src->pub.fill_input_buffer = fill_input_buffer;
  src->pub.skip_input_data = skip_input_data;
  src->pub.resync_to_restart = jpeg_resync_to_restart; /* use default method */
  src->pub.term_source = term_source;
  src->infile = infile;
  src->pub.bytes_in_buffer = 0; /* forces fill_input_buffer on first read */
  src->pub.next_input_byte = NULL; /* until buffer loaded */
}